

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void __thiscall
wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::doWalkModule
          (Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *this,
          Module *module)

{
  Table *pTVar1;
  long lVar2;
  long *plVar3;
  Function *pFVar4;
  undefined8 *puVar5;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  long *plVar6;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  long lVar7;
  undefined8 *puVar8;
  
  pTVar1 = (Table *)(this[-1].stack.fixed._M_elems + 7);
  lVar2 = *(long *)(module + 8);
  for (lVar7 = *(long *)module; lVar7 != lVar2; lVar7 = lVar7 + 8) {
    wasm::ReFinalize::visitExport((Export *)pTVar1);
  }
  plVar3 = *(long **)(module + 0x38);
  for (plVar6 = *(long **)(module + 0x30); plVar6 != plVar3; plVar6 = plVar6 + 1) {
    if (*(long *)(*plVar6 + 0x20) == 0) {
      walk(this,(Expression **)(*plVar6 + 0x40));
    }
    wasm::ReFinalize::visitGlobal((Global *)pTVar1);
  }
  plVar3 = *(long **)(module + 0x20);
  for (plVar6 = *(long **)(module + 0x18); plVar6 != plVar3; plVar6 = plVar6 + 1) {
    pFVar4 = (Function *)*plVar6;
    if ((pFVar4->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
      this->currFunction = pFVar4;
      walk(this,&pFVar4->body);
      this->currFunction = (Function *)0x0;
    }
  }
  lVar2 = *(long *)(module + 0x50);
  for (lVar7 = *(long *)(module + 0x48); lVar7 != lVar2; lVar7 = lVar7 + 8) {
    wasm::ReFinalize::visitTag((Tag *)pTVar1);
  }
  puVar5 = *(undefined8 **)(module + 0x68);
  for (puVar8 = *(undefined8 **)(module + 0x60); puVar8 != puVar5; puVar8 = puVar8 + 1) {
    walkElementSegment(this,(ElementSegment *)*puVar8);
  }
  lVar2 = *(long *)(module + 0xb0);
  for (lVar7 = *(long *)(module + 0xa8); lVar7 != lVar2; lVar7 = lVar7 + 8) {
    wasm::ReFinalize::visitTable(pTVar1);
  }
  puVar5 = *(undefined8 **)(module + 0x98);
  for (puVar8 = *(undefined8 **)(module + 0x90); puVar8 != puVar5; puVar8 = puVar8 + 1) {
    walkDataSegment(this,(DataSegment *)*puVar8);
  }
  lVar2 = *(long *)(module + 0x80);
  for (lVar7 = *(long *)(module + 0x78); lVar7 != lVar2; lVar7 = lVar7 + 8) {
    wasm::ReFinalize::visitMemory((Memory *)pTVar1);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Dispatch statically through the SubType.
    SubType* self = static_cast<SubType*>(this);
    for (auto& curr : module->exports) {
      self->visitExport(curr.get());
    }
    for (auto& curr : module->globals) {
      if (curr->imported()) {
        self->visitGlobal(curr.get());
      } else {
        self->walkGlobal(curr.get());
      }
    }
    for (auto& curr : module->functions) {
      if (curr->imported()) {
        self->visitFunction(curr.get());
      } else {
        self->walkFunction(curr.get());
      }
    }
    for (auto& curr : module->tags) {
      if (curr->imported()) {
        self->visitTag(curr.get());
      } else {
        self->walkTag(curr.get());
      }
    }
    for (auto& curr : module->elementSegments) {
      self->walkElementSegment(curr.get());
    }
    for (auto& curr : module->tables) {
      self->walkTable(curr.get());
    }
    for (auto& curr : module->dataSegments) {
      self->walkDataSegment(curr.get());
    }
    for (auto& curr : module->memories) {
      self->walkMemory(curr.get());
    }
  }